

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O3

string * __thiscall
cfd::api::HDWalletApi::CreateExtPubkey
          (string *__return_storage_ptr__,HDWalletApi *this,string *extkey,NetType net_type)

{
  uint32_t uVar1;
  CfdException *this_00;
  uint32_t uVar2;
  ExtPrivkey privkey;
  uint32_t local_10c;
  undefined1 local_108 [40];
  pointer local_e0;
  pointer local_c8;
  pointer local_b0;
  ExtPrivkey local_98;
  
  core::ExtPrivkey::ExtPrivkey(&local_98,extkey);
  uVar1 = core::ExtPrivkey::GetVersion(&local_98);
  uVar2 = 0x4358394;
  if (net_type == kLiquidV1) {
    uVar2 = 0x488ade4;
  }
  if (net_type == kMainnet) {
    uVar2 = 0x488ade4;
  }
  if (uVar1 == uVar2) {
    core::ExtPrivkey::GetExtPubkey((ExtPubkey *)local_108,&local_98);
    core::ExtPubkey::ToString_abi_cxx11_(__return_storage_ptr__,(ExtPubkey *)local_108);
    if (local_b0 != (pointer)0x0) {
      operator_delete(local_b0);
    }
    if (local_c8 != (pointer)0x0) {
      operator_delete(local_c8);
    }
    if (local_e0 != (pointer)0x0) {
      operator_delete(local_e0);
    }
    if ((pointer)local_108._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._0_8_);
    }
    if (local_98.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.tweak_sum_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_98.privkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.privkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_98.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.chaincode_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_98.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.serialize_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_108._0_8_ = "cfdapi_hdwallet.cpp";
  local_108._8_4_ = 0x125;
  local_108._16_8_ = (long)"CfdCreateExtPubkey" + 3;
  local_10c = core::ExtPrivkey::GetVersion(&local_98);
  core::logger::log<unsigned_int&>
            ((CfdSourceLocation *)local_108,kCfdLogLevelWarning,"Version unmatch. key version: {}",
             &local_10c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_108._0_8_ = local_108 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_108,"extkey networkType unmatch.","");
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_108);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string HDWalletApi::CreateExtPubkey(
    const std::string& extkey, NetType net_type) const {
  ExtPrivkey privkey(extkey);
  uint32_t check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);
  if (privkey.GetVersion() != check_version) {
    warn(
        CFD_LOG_SOURCE, "Version unmatch. key version: {}",
        privkey.GetVersion());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return privkey.GetExtPubkey().ToString();
}